

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  value_type *pvVar2;
  Expression *pEVar3;
  ArrayFill *pAVar4;
  ulong uVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  ArrayCopy *ifTrue;
  If *pIVar8;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  optional<wasm::Type> local_1b0;
  optional<wasm::Type> local_198;
  ArrayCopy *local_188;
  ArrayCopy *copy;
  BoundsCheck srcCheck;
  BoundsCheck check_1;
  Expression *length_1;
  Expression *srcRef;
  Expression *local_118;
  Expression *srcIndex;
  uintptr_t local_108;
  Type local_100;
  uintptr_t local_f8;
  uintptr_t local_f0;
  Field srcElement;
  value_type srcArrayType;
  optional<wasm::Type> local_d0;
  ArrayFill *local_c0;
  ArrayFill *fill;
  BoundsCheck check;
  Expression *length;
  Expression *value;
  Expression *ref;
  Expression *local_60;
  Expression *index;
  uintptr_t local_50;
  Type local_48;
  Field element;
  value_type arrayType;
  BasicType local_24;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_24 = none;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_24);
  if (!bVar1) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13d7,"Expression *wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(Type)");
  }
  bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(&this->mutableArrays);
  if (bVar1) {
    pEVar3 = makeTrivial(this,(Type)this_local);
    return pEVar3;
  }
  pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (this,&this->mutableArrays);
  element._8_8_ = pvVar2->id;
  ::wasm::HeapType::getArray();
  local_48.id = (uintptr_t)index;
  element.type.id = local_50;
  Type::Type((Type *)&ref,i32);
  local_60 = make(this,(Type)ref);
  pEVar3 = makeTrappingRefUse(this,(HeapType)element._8_8_);
  bVar1 = oneIn(this,2);
  if (bVar1) {
    pEVar6 = make(this,local_48);
    Type::Type((Type *)&check.getLength,i32);
    pEVar7 = make(this,(Type)check.getLength);
    if (((this->allowOOB & 1U) != 0) && (bVar1 = oneIn(this,10), bVar1)) {
      pAVar4 = Builder::makeArrayFill(&this->builder,pEVar3,local_60,pEVar6,pEVar7);
      return (Expression *)pAVar4;
    }
    makeArrayBoundsCheck
              ((BoundsCheck *)&fill,pEVar3,local_60,this->funcContext->func,&this->builder,pEVar7);
    pAVar4 = Builder::makeArrayFill
                       (&this->builder,check.condition,check.getRef,pEVar6,check.getIndex);
    local_c0 = pAVar4;
    std::optional<wasm::Type>::optional(&local_d0);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_d0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_d0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pIVar8 = Builder::makeIf(&this->builder,(Expression *)fill,(Expression *)pAVar4,
                             (Expression *)0x0,type_00);
    return (Expression *)pIVar8;
  }
  pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (this,&this->mutableArrays);
  srcElement._8_8_ = pvVar2->id;
  ::wasm::HeapType::getArray();
  local_f0 = local_100.id;
  srcElement.type.id = local_f8;
  local_108 = local_100.id;
  srcIndex = (Expression *)local_48.id;
  uVar5 = ::wasm::Type::isSubType(local_100,local_48);
  if ((uVar5 & 1) != 0) {
    if ((int)element.type.id == (int)srcElement.type.id) goto LAB_00216ab0;
  }
  srcElement.packedType = element.packedType;
  srcElement.mutable_ = element.mutable_;
  local_f0 = local_48.id;
  srcElement.type = element.type;
LAB_00216ab0:
  Type::Type((Type *)&srcRef,i32);
  local_118 = make(this,(Type)srcRef);
  pEVar6 = makeTrappingRefUse(this,(HeapType)srcElement._8_8_);
  Type::Type((Type *)&check_1.getLength,i32);
  pEVar7 = make(this,(Type)check_1.getLength);
  if (((this->allowOOB & 1U) == 0) || (bVar1 = oneIn(this,10), !bVar1)) {
    makeArrayBoundsCheck
              ((BoundsCheck *)&srcCheck.getLength,pEVar3,local_60,this->funcContext->func,
               &this->builder,pEVar7);
    makeArrayBoundsCheck
              ((BoundsCheck *)&copy,pEVar6,local_118,this->funcContext->func,&this->builder,
               check_1.getIndex);
    ifTrue = Builder::makeArrayCopy
                       (&this->builder,check_1.condition,check_1.getRef,srcCheck.condition,
                        srcCheck.getRef,srcCheck.getIndex);
    local_188 = ifTrue;
    std::optional<wasm::Type>::optional(&local_198);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_198.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_198.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pIVar8 = Builder::makeIf(&this->builder,(Expression *)copy,(Expression *)ifTrue,
                             (Expression *)0x0,type_01);
    std::optional<wasm::Type>::optional(&local_1b0);
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_1b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_1b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    type_local.id =
         (uintptr_t)
         Builder::makeIf(&this->builder,srcCheck.getLength,(Expression *)pIVar8,(Expression *)0x0,
                         type_02);
  }
  else {
    type_local.id =
         (uintptr_t)Builder::makeArrayCopy(&this->builder,pEVar3,local_60,pEVar6,local_118,pEVar7);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayBulkMemoryOp(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto element = arrayType.getArray().element;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  if (oneIn(2)) {
    // ArrayFill
    auto* value = make(element.type);
    auto* length = make(Type::i32);
    // Only rarely emit a plain get which might trap. See related logic in
    // ::makePointer().
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayFill(ref, index, value, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto* fill = builder.makeArrayFill(
      check.getRef, check.getIndex, value, check.getLength);
    return builder.makeIf(check.condition, fill);
  } else {
    // ArrayCopy. Here we must pick a source array whose element type is a
    // subtype of the destination.
    auto srcArrayType = pick(mutableArrays);
    auto srcElement = srcArrayType.getArray().element;
    if (!Type::isSubType(srcElement.type, element.type) ||
        element.packedType != srcElement.packedType) {
      // TODO: A matrix of which arrays are subtypes of others. For now, if we
      // didn't get what we want randomly, just copy from the same type to
      // itself.
      srcArrayType = arrayType;
      srcElement = element;
    }
    auto* srcIndex = make(Type::i32);
    auto* srcRef = makeTrappingRefUse(srcArrayType);
    auto* length = make(Type::i32);
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayCopy(ref, index, srcRef, srcIndex, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto srcCheck = makeArrayBoundsCheck(
      srcRef, srcIndex, funcContext->func, builder, check.getLength);
    auto* copy = builder.makeArrayCopy(check.getRef,
                                       check.getIndex,
                                       srcCheck.getRef,
                                       srcCheck.getIndex,
                                       srcCheck.getLength);
    return builder.makeIf(check.condition,
                          builder.makeIf(srcCheck.condition, copy));
  }
}